

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

double ClipperLib::Area(OutRec *outRec,bool UseFullInt64Range)

{
  OutPt **ppOVar1;
  IntPoint *pIVar2;
  IntPoint *pIVar3;
  ulong uVar4;
  ulong uVar5;
  OutPt *pOVar6;
  ulong uVar7;
  long lVar8;
  OutPt *pOVar9;
  bool bVar10;
  double a;
  double dVar11;
  Int128 local_a0;
  long local_90;
  long local_88;
  Int128 local_80;
  Int128 local_70;
  long local_60;
  long local_58;
  Int128 local_50;
  Int128 local_40;
  
  pOVar9 = outRec->pts;
  if (pOVar9 == (OutPt *)0x0) {
    dVar11 = 0.0;
  }
  else {
    if (UseFullInt64Range) {
      uVar5 = 0;
      lVar8 = 0;
      do {
        local_50.lo = (pOVar9->prev->pt).X;
        local_50.hi = local_50.lo >> 0x3f;
        local_58 = (pOVar9->pt).Y;
        local_60 = local_58 >> 0x3f;
        Int128::operator*(&local_40,&local_50);
        local_80.lo = (pOVar9->pt).X;
        local_80.hi = local_80.lo >> 0x3f;
        local_88 = (pOVar9->prev->pt).Y;
        local_90 = local_88 >> 0x3f;
        Int128::operator*(&local_70,&local_80);
        uVar7 = ~local_70.hi;
        if (local_70.lo == 0) {
          uVar7 = -local_70.hi;
        }
        uVar4 = local_40.lo - local_70.lo;
        lVar8 = lVar8 + local_40.hi + uVar7 + (ulong)(uVar4 < (ulong)-local_70.lo);
        bVar10 = CARRY8(uVar4,uVar5);
        uVar5 = uVar4 + uVar5;
        if (bVar10) {
          lVar8 = lVar8 + 1;
        }
        pOVar9 = pOVar9->next;
        local_a0.hi = lVar8;
        local_a0.lo = uVar5;
      } while (pOVar9 != outRec->pts);
      dVar11 = Int128::AsDouble(&local_a0);
    }
    else {
      dVar11 = 0.0;
      pOVar6 = pOVar9;
      do {
        ppOVar1 = &pOVar6->prev;
        pIVar3 = &pOVar6->pt;
        pIVar2 = &pOVar6->pt;
        pOVar6 = pOVar6->next;
        dVar11 = dVar11 + (double)(pIVar3->Y * ((*ppOVar1)->pt).X - ((*ppOVar1)->pt).Y * pIVar2->X);
      } while (pOVar6 != pOVar9);
    }
    dVar11 = dVar11 * 0.5;
  }
  return dVar11;
}

Assistant:

double Area(const OutRec &outRec, bool UseFullInt64Range)
{
  if (!outRec.pts)
    return 0.0;

  OutPt *op = outRec.pts;
  if (UseFullInt64Range) {
    Int128 a(0);
    do {
      a += (Int128(op->prev->pt.X) * Int128(op->pt.Y)) -
        Int128(op->pt.X) * Int128(op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a.AsDouble() / 2;
  }
  else
  {
    double a = 0;
    do {
      a += (op->prev->pt.X * op->pt.Y) - (op->pt.X * op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a/2;
  }
}